

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

TypeGenericClass * __thiscall
ExpressionContext::GetGenericClassType
          (ExpressionContext *this,SynBase *source,TypeGenericClassProto *proto,
          IntrusiveList<TypeHandle> generics)

{
  SmallArray<TypeGenericClass_*,_128U> *this_00;
  TypeBase **ppTVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  TypeHandle *pTVar5;
  ulong uVar6;
  char *__function;
  byte bVar7;
  TypeHandle *pTVar8;
  TypeHandle *pTVar9;
  ulong uVar10;
  TypeGenericClass *unaff_R14;
  bool bVar11;
  InplaceStr IVar12;
  TypeGenericClass *pTVar4;
  
  pTVar5 = generics.head;
  this_00 = &this->genericClassTypes;
  uVar6 = (ulong)(this->genericClassTypes).count;
  bVar11 = uVar6 != 0;
  if (bVar11) {
    uVar10 = 0;
    do {
      pTVar4 = this_00->data[uVar10];
      if (pTVar4 == (TypeGenericClass *)0x0) {
        bVar7 = 0;
      }
      else {
        bVar7 = 0;
        if (pTVar4->proto == proto) {
          pTVar8 = (pTVar4->generics).head;
          pTVar9 = pTVar5;
          if (pTVar8 != (TypeHandle *)0x0 && pTVar5 != (TypeHandle *)0x0) {
            while (pTVar8->type == pTVar9->type) {
              pTVar9 = pTVar9->next;
              pTVar8 = pTVar8->next;
              if ((pTVar8 == (TypeHandle *)0x0) || (pTVar9 == (TypeHandle *)0x0)) break;
            }
          }
          bVar7 = (pTVar8 != pTVar9) * '\x03' + 1;
          if (pTVar8 == pTVar9) {
            unaff_R14 = pTVar4;
          }
        }
      }
      if ((bVar7 & 3) != 0) break;
      uVar10 = uVar10 + 1;
      bVar11 = uVar10 < uVar6;
    } while (uVar10 != uVar6);
  }
  if (bVar11) {
    return unaff_R14;
  }
  iVar2 = (*this->allocator->_vptr_Allocator[2])(this->allocator,0x78);
  pTVar4 = (TypeGenericClass *)CONCAT44(extraout_var,iVar2);
  IVar12 = GetGenericClassTypeName(this,&proto->super_TypeBase,generics);
  (pTVar4->super_TypeBase)._vptr_TypeBase = (_func_int **)&PTR__TypeBase_00248770;
  (pTVar4->super_TypeBase).typeID = 0x17;
  (pTVar4->super_TypeBase).name = IVar12;
  (pTVar4->super_TypeBase).arrayTypes.head = (TypeHandle *)0x0;
  (pTVar4->super_TypeBase).arrayTypes.tail = (TypeHandle *)0x0;
  uVar3 = NULLC::GetStringHash(IVar12.begin,IVar12.end);
  (pTVar4->super_TypeBase).nameHash = uVar3;
  (pTVar4->super_TypeBase).importModule = (ModuleData *)0x0;
  (pTVar4->super_TypeBase).typeIndex = 0xffffffff;
  (pTVar4->super_TypeBase).refType = (TypeRef *)0x0;
  (pTVar4->super_TypeBase).unsizedArrayType = (TypeUnsizedArray *)0x0;
  *(undefined8 *)&(pTVar4->super_TypeBase).alignment = 0;
  *(undefined8 *)((long)&(pTVar4->super_TypeBase).size + 4) = 0;
  *(undefined4 *)((long)&(pTVar4->super_TypeBase).padding + 3) = 0;
  (pTVar4->super_TypeBase)._vptr_TypeBase = (_func_int **)&PTR__TypeBase_002488f8;
  pTVar4->proto = proto;
  (pTVar4->generics).head = pTVar5;
  (pTVar4->generics).tail = generics.tail;
  (pTVar4->super_TypeBase).isGeneric = true;
  if ((uint)(*(int *)&(pTVar4->super_TypeBase).name.end -
            *(int *)&(pTVar4->super_TypeBase).name.begin) < 0x2001) {
    uVar3 = (this->genericClassTypes).count;
    if (uVar3 == (this->genericClassTypes).max) {
      SmallArray<TypeGenericClass_*,_128U>::grow(this_00,uVar3);
    }
    if (this_00->data != (TypeGenericClass **)0x0) {
      uVar3 = (this->genericClassTypes).count;
      (this->genericClassTypes).count = uVar3 + 1;
      this_00->data[uVar3] = pTVar4;
      uVar3 = (this->types).count;
      if (uVar3 == (this->types).max) {
        SmallArray<TypeBase_*,_128U>::grow(&this->types,uVar3);
      }
      ppTVar1 = (this->types).data;
      if (ppTVar1 != (TypeBase **)0x0) {
        uVar3 = (this->types).count;
        (this->types).count = uVar3 + 1;
        ppTVar1[uVar3] = (TypeBase *)pTVar4;
        return pTVar4;
      }
      __function = 
      "void SmallArray<TypeBase *, 128>::push_back(const T &) [T = TypeBase *, N = 128]";
      goto LAB_0015fc9a;
    }
  }
  else {
    Stop(this,source,"ERROR: generated generic type name exceeds maximum type length \'%d\'",0x2000)
    ;
  }
  __function = 
  "void SmallArray<TypeGenericClass *, 128>::push_back(const T &) [T = TypeGenericClass *, N = 128]"
  ;
LAB_0015fc9a:
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,__function);
}

Assistant:

TypeGenericClass* ExpressionContext::GetGenericClassType(SynBase *source, TypeGenericClassProto *proto, IntrusiveList<TypeHandle> generics)
{
	for(unsigned i = 0, e = genericClassTypes.count; i < e; i++)
	{
		if(TypeGenericClass *type = genericClassTypes.data[i])
		{
			if(type->proto != proto)
				continue;

			TypeHandle *leftArg = type->generics.head;
			TypeHandle *rightArg = generics.head;

			while(leftArg && rightArg && leftArg->type == rightArg->type)
			{
				leftArg = leftArg->next;
				rightArg = rightArg->next;
			}

			if(leftArg != rightArg)
				continue;

			return type;
		}
	}

	// Create new type
	TypeGenericClass *result = new (get<TypeGenericClass>()) TypeGenericClass(GetGenericClassTypeName(*this, proto, generics), proto, generics);

	if(result->name.length() > NULLC_MAX_TYPE_NAME_LENGTH)
		Stop(source, "ERROR: generated generic type name exceeds maximum type length '%d'", NULLC_MAX_TYPE_NAME_LENGTH);

	genericClassTypes.push_back(result);
	types.push_back(result);

	return result;
}